

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O0

ptr<snapshot_sync_req> cornerstone::snapshot_sync_req::deserialize(buffer *buf)

{
  ulong size;
  byte *__src;
  shared_ptr<cornerstone::snapshot> *psVar1;
  shared_ptr<cornerstone::snapshot> *args;
  unsigned_long *args_1;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *args_2;
  size_t __n;
  pointer this;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<snapshot_sync_req> pVar2;
  bufptr b;
  size_t sz;
  byte *src;
  bool done;
  ulong offset;
  ptr<snapshot> snp;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *in_stack_ffffffffffffff40;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *in_stack_ffffffffffffff48;
  unsigned_long *in_stack_ffffffffffffff50;
  buffer *in_stack_ffffffffffffff60;
  buffer *in_stack_ffffffffffffff88;
  
  snapshot::deserialize(in_stack_ffffffffffffff88);
  size = buffer::get_ulong((buffer *)in_RDI);
  buffer::get_byte(in_stack_ffffffffffffff60);
  __src = buffer::data(in_RSI);
  psVar1 = (shared_ptr<cornerstone::snapshot> *)buffer::pos(in_RSI);
  args = (shared_ptr<cornerstone::snapshot> *)buffer::size(in_RSI);
  if (psVar1 < args) {
    args_1 = (unsigned_long *)buffer::size(in_RSI);
    args_2 = (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)buffer::pos(in_RSI)
    ;
    __n = (long)args_1 - (long)args_2;
    buffer::alloc(size);
    this = std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
                     ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1e54f2);
    this_00 = (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)buffer::data(this)
    ;
    memcpy(this_00,__src,__n);
    cs_new<cornerstone::snapshot_sync_req,std::shared_ptr<cornerstone::snapshot>&,unsigned_long&,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,bool&>
              (args,args_1,args_2,(bool *)this_00);
    std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(this_00);
  }
  else {
    buffer::alloc(size);
    cs_new<cornerstone::snapshot_sync_req,std::shared_ptr<cornerstone::snapshot>&,unsigned_long&,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,bool&>
              (args,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (bool *)in_stack_ffffffffffffff40);
    std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
              (in_stack_ffffffffffffff40);
  }
  std::shared_ptr<cornerstone::snapshot>::~shared_ptr((shared_ptr<cornerstone::snapshot> *)0x1e5611)
  ;
  pVar2.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar2.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (ptr<snapshot_sync_req>)
         pVar2.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer& buf)
{
    ptr<snapshot> snp(snapshot::deserialize(buf));
    ulong offset = buf.get_ulong();
    bool done = buf.get_byte() == 1;
    byte* src = buf.data();
    if (buf.pos() < buf.size())
    {
        size_t sz = buf.size() - buf.pos();
        bufptr b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
        return cs_new<snapshot_sync_req>(snp, offset, std::move(b), done);
    }
    else
    {
        return cs_new<snapshot_sync_req>(snp, offset, buffer::alloc(0), done);
    }
}